

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void compact_int64_suite::fail_array8_int64_missing_seven(void)

{
  value_type input [3];
  decoder decoder;
  uchar local_44 [4];
  undefined4 local_40;
  value local_3c;
  decoder local_38;
  
  local_38.input._M_str = local_44;
  local_44[2] = 0x11;
  local_44[0] = 0xae;
  local_44[1] = '\b';
  local_38.input._M_len = 3;
  local_38.current.view._M_len = 0;
  local_38.current.view._M_str = (uchar *)0x0;
  local_38.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_38);
  local_3c = local_38.current.code;
  local_40 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xac3,"void compact_int64_suite::fail_array8_int64_missing_seven()",&local_3c,
             &local_40);
  return;
}

Assistant:

void fail_array8_int64_missing_seven()
{
    const value_type input[] = { token::code::array8_int64, 0x08, 0x11 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}